

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast_t.cpp
# Opt level: O0

int __thiscall deci::ast_for_t::Generate(ast_for_t *this,ostream *output,int pc)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  ostream *poVar4;
  int local_1c;
  int check_loc;
  int pc_local;
  ostream *output_local;
  ast_for_t *this_local;
  
  iVar1 = (*this->start->_vptr_ast_item_t[2])(this->start,output,(ulong)(uint)pc);
  poVar4 = std::operator<<(output,"set ");
  poVar4 = std::operator<<(poVar4,(string *)&this->identifier);
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  uVar2 = iVar1 + 1;
  poVar4 = std::operator<<(output,": __for_");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,uVar2);
  poVar4 = std::operator<<(poVar4,"__");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  iVar1 = (*this->finish->_vptr_ast_item_t[2])(this->finish,output,(ulong)uVar2);
  poVar4 = std::operator<<(output,"rval ");
  poVar4 = std::operator<<(poVar4,(string *)&this->identifier);
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  poVar4 = std::operator<<(output,"bin gr");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  poVar4 = std::operator<<(output,"jz __end_for_");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,uVar2);
  poVar4 = std::operator<<(poVar4,"__");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  (this->super_ast_loop_t).end_loc_pos = uVar2;
  uVar3 = ast_t::Generate(this->loop,output,iVar1 + 3);
  if (this->step == (ast_item_t *)0x0) {
    poVar4 = std::operator<<(output,"push 1");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    local_1c = uVar3 + 1;
  }
  else {
    local_1c = (*this->step->_vptr_ast_item_t[2])(this->step,output,(ulong)uVar3);
  }
  poVar4 = std::operator<<(output,"rval ");
  poVar4 = std::operator<<(poVar4,(string *)&this->identifier);
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  poVar4 = std::operator<<(output,"bin sum");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  poVar4 = std::operator<<(output,"set ");
  poVar4 = std::operator<<(poVar4,(string *)&this->identifier);
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  poVar4 = std::operator<<(output,"jmp __for_");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,uVar2);
  poVar4 = std::operator<<(poVar4,"__");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  poVar4 = std::operator<<(output,": __end_for_");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,uVar2);
  poVar4 = std::operator<<(poVar4,"__");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  return local_1c + 4;
}

Assistant:

int ast_for_t::Generate(std::ostream& output, int pc) const {
    pc = start->Generate(output, pc);

    output << "set " << this->identifier << std::endl;
    ++pc;

    int check_loc = pc;

    output << ": __for_" << check_loc << "__" << std::endl;

    pc = finish->Generate(output, pc);
    output << "rval " << this->identifier << std::endl;
    output << "bin gr" << std::endl;
    pc += 2;

    output << "jz __end_for_" << check_loc << "__" << std::endl;
    ++pc;

    this->end_loc_pos = check_loc;
    pc = loop->Generate(output, pc);

    if (this->step != nullptr) {
      pc = this->step->Generate(output, pc);
    }
    else {
      output << "push 1" << std::endl;
      ++pc;
    }
    output << "rval " << this->identifier << std::endl;
    output << "bin sum" << std::endl;
    output << "set " << this->identifier << std::endl;
    pc += 3;

    output << "jmp __for_" << check_loc << "__" << std::endl;
    ++pc;

    output << ": __end_for_" << check_loc << "__" << std::endl;

    return pc;
  }